

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O0

void __thiscall LRGrammaticalAnalyzer::LRGrammaticalAnalyzer(LRGrammaticalAnalyzer *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  undefined4 uVar1;
  bool bVar2;
  istream *piVar3;
  long *plVar4;
  mapped_type_conflict1 *pmVar5;
  mapped_type *this_00;
  reference ppVar6;
  ostream *poVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_cb8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c68;
  string local_c60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> y;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  x;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1;
  int local_b9c;
  undefined1 local_b98 [4];
  int i;
  string item;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rightpart;
  undefined1 local_b58 [4];
  int sz;
  string leftpart;
  ifstream readproduction;
  undefined1 local_930 [8];
  string to;
  ifstream readaction;
  undefined1 local_708 [8];
  string fr;
  int toid;
  int stid;
  ifstream readgoto;
  allocator local_4d6;
  allocator local_4d5;
  allocator local_4d4;
  allocator local_4d3;
  allocator local_4d2;
  allocator local_4d1;
  allocator local_4d0;
  allocator local_4cf;
  allocator local_4ce;
  allocator local_4cd;
  allocator local_4cc;
  allocator local_4cb;
  allocator local_4ca;
  allocator local_4c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  iterator local_300;
  size_type local_2f8;
  undefined1 local_2ee;
  allocator local_2ed;
  allocator local_2ec;
  allocator local_2eb;
  allocator local_2ea;
  allocator local_2e9;
  allocator local_2e8;
  allocator local_2e7;
  allocator local_2e6;
  allocator local_2e5;
  allocator local_2e4;
  allocator local_2e3;
  allocator local_2e2;
  allocator local_2e1;
  allocator local_2e0;
  allocator local_2df;
  allocator local_2de;
  allocator local_2dd;
  allocator local_2dc;
  allocator local_2db;
  allocator local_2da;
  allocator local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  LRGrammaticalAnalyzer *local_10;
  LRGrammaticalAnalyzer *this_local;
  
  local_10 = this;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->VT);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->VN);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->FIRST);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map(&this->FOLLOW);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::multimap(&this->P);
  std::__cxx11::string::string((string *)&this->START);
  local_c68 = this->ACTION;
  do {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(local_c68);
    local_c68 = local_c68 + 1;
  } while (local_c68 !=
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)this->GOTO);
  local_cb8 = this->GOTO;
  do {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map(local_cb8);
    local_cb8 = local_cb8 + 1;
  } while (local_cb8 !=
           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *)&this->VectorP);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector(&this->VectorP);
  std::__cxx11::string::operator=((string *)&this->START,"program\'");
  local_2ee = '\x01';
  local_2d8 = &local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d0,"{",&local_2d9);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"}",&local_2da);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"if",&local_2db);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"(",&local_2dc);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,")",&local_2dd);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"then",&local_2de);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"else",&local_2df);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"while",&local_2e0);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,">",&local_2e1);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"<",&local_2e2);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"<=",&local_2e3);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,">=",&local_2e4);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"==",&local_2e5);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"=",&local_2e6);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,";",&local_2e7);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"ID",&local_2e8);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"NUM",&local_2e9);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"+",&local_2ea);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"-",&local_2eb);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"*",&local_2ec);
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"/",&local_2ed);
  local_2ee = '\0';
  local_30 = &local_2d0;
  local_28 = 0x15;
  __l_00._M_len = 0x15;
  __l_00._M_array = local_30;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->VT,__l_00);
  local_e30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_e30 = local_e30 + -1;
    std::__cxx11::string::~string((string *)local_e30);
  } while (local_e30 != &local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ed);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ec);
  std::allocator<char>::~allocator((allocator<char> *)&local_2eb);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ea);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e7);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e6);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e5);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e4);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e3);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e2);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2df);
  std::allocator<char>::~allocator((allocator<char> *)&local_2de);
  std::allocator<char>::~allocator((allocator<char> *)&local_2dd);
  std::allocator<char>::~allocator((allocator<char> *)&local_2dc);
  std::allocator<char>::~allocator((allocator<char> *)&local_2db);
  std::allocator<char>::~allocator((allocator<char> *)&local_2da);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  local_4c8 = &local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4c0,"program",&local_4c9);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"compoundstmt",&local_4ca);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"stmt",&local_4cb);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"ifstmt",&local_4cc);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"whilestmt",&local_4cd);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"assgstmt",&local_4ce);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"stmts",&local_4cf);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"boolexpr",&local_4d0);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"arithexpr",&local_4d1);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"multexpr",&local_4d2);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"arithexprprime",&local_4d3);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"simpleexpr",&local_4d4);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"multexprprime",&local_4d5);
  local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"boolop",&local_4d6);
  local_300 = &local_4c0;
  local_2f8 = 0xe;
  __l._M_len = 0xe;
  __l._M_array = local_300;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->VN,__l);
  local_f28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_300;
  do {
    local_f28 = local_f28 + -1;
    std::__cxx11::string::~string((string *)local_f28);
  } while (local_f28 != &local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d6);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d5);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d4);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d3);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d2);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4cf);
  std::allocator<char>::~allocator((allocator<char> *)&local_4ce);
  std::allocator<char>::~allocator((allocator<char> *)&local_4cd);
  std::allocator<char>::~allocator((allocator<char> *)&local_4cc);
  std::allocator<char>::~allocator((allocator<char> *)&local_4cb);
  std::allocator<char>::~allocator((allocator<char> *)&local_4ca);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::ifstream::ifstream(&toid,"GOTO.txt",_S_in);
  std::__cxx11::string::string((string *)local_708);
  while( true ) {
    piVar3 = (istream *)
             std::istream::operator>>((istream *)&toid,(int *)(fr.field_2._M_local_buf + 0xc));
    piVar3 = std::operator>>(piVar3,(string *)local_708);
    plVar4 = (long *)std::istream::operator>>(piVar3,(int *)(fr.field_2._M_local_buf + 8));
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    uVar1 = fr.field_2._8_4_;
    if (!bVar2) break;
    if (fr.field_2._8_4_ != 0) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](this->GOTO + (int)fr.field_2._12_4_,(key_type *)local_708);
      *pmVar5 = uVar1;
    }
  }
  std::ifstream::close();
  std::ifstream::ifstream((void *)((long)&to.field_2 + 8),"ACTION.txt",_S_in);
  std::__cxx11::string::string((string *)local_930);
  while( true ) {
    piVar3 = (istream *)
             std::istream::operator>>
                       ((istream *)(to.field_2._M_local_buf + 8),
                        (int *)(fr.field_2._M_local_buf + 0xc));
    piVar3 = std::operator>>(piVar3,(string *)local_708);
    piVar3 = std::operator>>(piVar3,(string *)local_930);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_930,"0");
    if (!bVar2) {
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](this->ACTION + (int)fr.field_2._12_4_,(key_type *)local_708);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_930);
    }
  }
  std::ifstream::close();
  std::ifstream::ifstream((void *)((long)&leftpart.field_2 + 8),"PRODUCTION.txt",_S_in);
  std::__cxx11::string::string((string *)local_b58);
  while( true ) {
    piVar3 = std::operator>>((istream *)(leftpart.field_2._M_local_buf + 8),(string *)local_b58);
    plVar4 = (long *)std::istream::operator>>
                               (piVar3,(int *)((long)&rightpart.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              + 4));
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&item.field_2 + 8));
    std::__cxx11::string::string((string *)local_b98);
    for (local_b9c = 0;
        local_b9c <
        rightpart.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_b9c = local_b9c + 1) {
      std::operator>>((istream *)(leftpart.field_2._M_local_buf + 8),(string *)local_b98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&item.field_2 + 8),(value_type *)local_b98);
    }
    std::
    make_pair<std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__range1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&item.field_2 + 8));
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::push_back(&this->VectorP,(value_type *)&__range1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__range1);
    std::__cxx11::string::~string((string *)local_b98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&item.field_2 + 8));
  }
  std::ifstream::close();
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::begin(&this->VectorP);
  x.second.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::end(&this->VectorP);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                     *)&x.second.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)
  {
    ppVar6 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ::operator*(&__end1);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range2,ppVar6);
    poVar7 = std::operator<<((ostream *)&std::cout,(string *)&__range2);
    std::operator<<(poVar7,' ');
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&x.first.field_2 + 8);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    y.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&y.field_2 + 8)), bVar2) {
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string(local_c60,(string *)pbVar8);
      poVar7 = std::operator<<((ostream *)&std::cout,local_c60);
      std::operator<<(poVar7,' ');
      std::__cxx11::string::~string(local_c60);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_b58);
  std::ifstream::~ifstream((void *)((long)&leftpart.field_2 + 8));
  std::__cxx11::string::~string((string *)local_930);
  std::ifstream::~ifstream((void *)((long)&to.field_2 + 8));
  std::__cxx11::string::~string((string *)local_708);
  std::ifstream::~ifstream(&toid);
  return;
}

Assistant:

LRGrammaticalAnalyzer::LRGrammaticalAnalyzer() {
//    GOTO[0]["S"] = 1;
//    GOTO[0]["B"] = 2;
//    GOTO[2]["B"] = 5;
//    GOTO[3]["B"] = 6;
//
//    //r0->r3
//    //r1->r2
//    //r2->r0
//    //r3->r1
//
//    ACTION[0]["a"] = "s3";
//    ACTION[0]["b"] = "s4";
//
//    ACTION[1]["$"] = "acc";
//
//    ACTION[2]["a"] = "s3";
//    ACTION[2]["b"] = "s4";
//
//    ACTION[3]["a"] = "s3";
//    ACTION[3]["b"] = "s4";
//
//    ACTION[4]["a"] = "r1";
//    ACTION[4]["b"] = "r1";
//    ACTION[4]["$"] = "r1";
//
//    ACTION[5]["a"] = "r2";
//    ACTION[5]["b"] = "r2";
//    ACTION[5]["$"] = "r2";
//
//    ACTION[6]["a"] = "r0";
//    ACTION[6]["b"] = "r0";
//    ACTION[6]["c"] = "r0";
//
//    START = "S'";
//    VT = {"a", "b", "$"};
//    VN = {"S", "B", "S'"};
//    P.insert({"S'", {"S"}});
//    P.insert({"S", {"B", "B"}});
//    P.insert({"B", {"a", "B"}});
//    P.insert({"B", {"b"}});
//
//    for (auto x:P)
//        VectorP.push_back(x);

//    for(auto x:VectorP){
//        std::cout<<x.first<<' ';
//        for(auto y:x.second){
//            std::cout<<y<<' ';
//        }
//        std::cout<<std::endl;
//    }

    START = "program'";
    VT = {"{", "}", "if", "(", ")", "then", "else", "while", ">", "<", "<=", ">=", "==", "=", ";", "ID", "NUM", "+",
          "-", "*", "/"};
    VN = {"program", "compoundstmt", "stmt", "ifstmt", "whilestmt", "assgstmt",
          "stmts", "boolexpr", "arithexpr", "multexpr", "arithexprprime", "simpleexpr",
          "multexprprime", "boolop"};

    std::ifstream readgoto("GOTO.txt");
    int stid, toid;
    std::string fr;
    while (readgoto >> stid >> fr >> toid) {
        if (toid == 0)
            continue;
        GOTO[stid][fr] = toid;
    }
    readgoto.close();

    std::ifstream readaction("ACTION.txt");
    std::string to;
    while (readaction >> stid >> fr >> to) {
        if (to == "0")
            continue;
        ACTION[stid][fr] = to;
    }
    readaction.close();

    std::ifstream readproduction("PRODUCTION.txt");
    std::string leftpart;
    int sz;
    while (readproduction >> leftpart >> sz) {
        std::vector<std::string> rightpart;
        std::string item;
        for (int i = 0; i < sz; i++) {
            readproduction >> item;
            rightpart.push_back(item);
        }
        VectorP.push_back(make_pair(leftpart, rightpart));
    }
    readproduction.close();
    for (auto x:VectorP) {
        std::cout << x.first << ' ';
        for (auto y:x.second) {
            std::cout << y << ' ';
        }
        std::cout << std::endl;
    }
}